

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_BrepFace * __thiscall
ON_Brep::NewRuledFace
          (ON_Brep *this,ON_BrepEdge *edgeA,bool bRevEdgeA,ON_BrepEdge *edgeB,bool bRevEdgeB)

{
  int vi0;
  int vi1;
  int vi0_00;
  ON_3dPoint point;
  ON_3dPoint point_00;
  int iVar1;
  ON_BrepEdge *pOVar2;
  ON_NurbsSurface *this_00;
  ON_BrepFace *pOVar3;
  bool bRev3d [4];
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  ON_NurbsCurve cB;
  ON_NurbsCurve cA;
  
  if (((edgeA->m_edge_index == edgeB->m_edge_index) ||
      (pOVar2 = Edge(this,edgeA->m_edge_index), pOVar2 != edgeA)) ||
     (pOVar2 = Edge(this,edgeB->m_edge_index), pOVar2 != edgeB)) {
    return (ON_BrepFace *)0x0;
  }
  ON_NurbsCurve::ON_NurbsCurve(&cA);
  ON_NurbsCurve::ON_NurbsCurve(&cB);
  iVar1 = (*(edgeA->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x3f])(0,edgeA,&cA,0);
  if (iVar1 != 0) {
    if (bRevEdgeA) {
      ON_NurbsCurve::Reverse(&cA);
    }
    iVar1 = (*(edgeB->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x3f])(0,edgeB,&cB,0);
    if (iVar1 != 0) {
      if (bRevEdgeB) {
        ON_NurbsCurve::Reverse(&cB);
      }
      this_00 = ON_NurbsSurface::New();
      iVar1 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x40])
                        (this_00,&cA,&cB,0,0);
      if (iVar1 != 0) {
        iVar1 = edgeA->m_vi[bRevEdgeA];
        vi0 = edgeA->m_vi[!bRevEdgeA];
        vi1 = edgeB->m_vi[!bRevEdgeB];
        vi0_00 = edgeB->m_vi[bRevEdgeB];
        local_c8 = iVar1;
        local_c4 = vi0;
        local_c0 = vi1;
        local_bc = vi0_00;
        if (vi0 == vi1) {
          point.y = ON_3dPoint::UnsetPoint.y;
          point.x = ON_3dPoint::UnsetPoint.x;
          point.z = ON_3dPoint::UnsetPoint.z;
          ON_NurbsSurface::CollapseSide(this_00,1,point);
          point_00.y = ON_3dPoint::UnsetPoint.y;
          point_00.x = ON_3dPoint::UnsetPoint.x;
          point_00.z = ON_3dPoint::UnsetPoint.z;
          ON_NurbsSurface::CollapseSide(this_00,3,point_00);
        }
        iStack_d4 = -1;
        iStack_d0 = 0xffffffff;
        iStack_cc = -1;
        local_d8 = edgeA->m_edge_index;
        bRev3d[1] = false;
        bRev3d[2] = false;
        bRev3d[3] = false;
        bRev3d[0] = bRevEdgeA;
        pOVar2 = FindLinearEdge(this,vi0,vi1);
        if (pOVar2 != (ON_BrepEdge *)0x0) {
          iStack_d4 = pOVar2->m_edge_index;
          bRev3d[1] = pOVar2->m_vi[0] == vi1;
        }
        iStack_d0 = edgeB->m_edge_index;
        bRev3d[2] = !bRevEdgeB;
        pOVar2 = FindLinearEdge(this,vi0_00,iVar1);
        if (pOVar2 != (ON_BrepEdge *)0x0) {
          iStack_cc = pOVar2->m_edge_index;
          bRev3d[3] = pOVar2->m_vi[0] == iVar1;
        }
        pOVar3 = NewFace(this,&this_00->super_ON_Surface,&local_c8,&local_d8,bRev3d);
        if (pOVar3 != (ON_BrepFace *)0x0) {
          SynchFaceOrientation(this,pOVar3->m_face_index);
        }
        goto LAB_00435df3;
      }
      (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
    }
  }
  pOVar3 = (ON_BrepFace *)0x0;
LAB_00435df3:
  ON_NurbsCurve::~ON_NurbsCurve(&cB);
  ON_NurbsCurve::~ON_NurbsCurve(&cA);
  return pOVar3;
}

Assistant:

ON_BrepFace* ON_Brep::NewRuledFace(
      const ON_BrepEdge& edgeA,
      bool bRevEdgeA,
      const ON_BrepEdge& edgeB, 
      bool bRevEdgeB
      )
{
  if ( edgeA.m_edge_index == edgeB.m_edge_index )
    return nullptr;
  if ( Edge( edgeA.m_edge_index) != &edgeA )
    return nullptr;
  if ( Edge( edgeB.m_edge_index) != &edgeB )
    return nullptr;

  ON_NurbsCurve cA, cB;
  if ( !edgeA.GetNurbForm( cA ) )
    return nullptr;
  if ( bRevEdgeA )
    cA.Reverse();
  if ( !edgeB.GetNurbForm( cB ) )
    return nullptr;
  if ( bRevEdgeB )
    cB.Reverse();
  ON_NurbsSurface* srf = ON_NurbsSurface::New();
  if ( !srf->CreateRuledSurface( cA, cB ) )
  {
    delete srf;
    return nullptr;
  }

  // corner vertices (sw,se,ne,nw)
  int vid[4] = {-1,-1,-1,-1};
  vid[0] = edgeA.m_vi[bRevEdgeA?1:0];
  vid[1] = edgeA.m_vi[bRevEdgeA?0:1];
  vid[2] = edgeB.m_vi[bRevEdgeB?0:1];
  vid[3] = edgeB.m_vi[bRevEdgeB?1:0];

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular east side
    srf->CollapseSide( 1 );
  }

  if ( vid[1] == vid[2] )
  {
    // make sure surface has a singular west side
    srf->CollapseSide( 3 );
  }

  // side edges (s,e,n,w)
  int eid[4] = {-1,-1,-1,-1};
  bool bRev3d[4] = {false,false,false,false};
  
  // south side
  eid[0] = edgeA.m_edge_index;
  bRev3d[0] = bRevEdgeA;
  
  // east side
  const ON_BrepEdge* east_edge = FindLinearEdge( *this, vid[1], vid[2] );
  if ( east_edge )
  {
    eid[1] = east_edge->m_edge_index;
    bRev3d[1] = (east_edge->m_vi[0] == vid[2]);
  }

  // north side
  eid[2] = edgeB.m_edge_index;
  bRev3d[2] = !bRevEdgeB;

  // west side
  const ON_BrepEdge* west_edge = FindLinearEdge( *this, vid[3], vid[0] );
  if ( west_edge )
  {
    eid[3] = west_edge->m_edge_index;
    bRev3d[3] = (west_edge->m_vi[0] == vid[0]);
  }

  ON_BrepFace* face = NewFace( srf, vid, eid, bRev3d );
  if ( face )
    SynchFaceOrientation( *this, face->m_face_index );
  return face;
}